

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QLocale *l)

{
  Territory TVar1;
  QDebug *this;
  QDebug *this_00;
  QDebug *pQVar2;
  QDebugStateSaver *this_01;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  bool isSys;
  QDebugStateSaver saver;
  QLocale *in_stack_fffffffffffffee8;
  QLocale *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefe;
  QDebug *in_stack_ffffffffffffff00;
  QDebug *in_stack_ffffffffffffff08;
  Script script;
  Territory territory;
  QDebugStateSaver *in_stack_ffffffffffffff10;
  QDebug *in_stack_ffffffffffffff18;
  char local_18 [8];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  script = (Script)((ulong)in_stack_ffffffffffffff08 >> 0x30);
  QLocale::system(local_18);
  operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  QLocale::~QLocale((QLocale *)0x4de35c);
  this = QDebug::nospace(in_RSI);
  QDebug::noquote(this);
  QDebug::operator<<(in_stack_ffffffffffffff18,(char *)this);
  QLocale::language((QLocale *)0x4de3c3);
  QLocale::languageToString(script);
  this_00 = QDebug::operator<<(in_stack_ffffffffffffff00,
                               (QString *)
                               CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8));
  QDebug::operator<<(this_00,(char *)this);
  QLocale::script((QLocale *)0x4de41f);
  QLocale::scriptToString(script);
  pQVar2 = QDebug::operator<<(in_stack_ffffffffffffff00,
                              (QString *)
                              CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8));
  territory = (Territory)((ulong)pQVar2 >> 0x30);
  pQVar2 = QDebug::operator<<(this_00,(char *)this);
  TVar1 = QLocale::territory((QLocale *)0x4de46f);
  QLocale::territoryToString(territory);
  this_01 = (QDebugStateSaver *)
            QDebug::operator<<(pQVar2,(QString *)CONCAT26(TVar1,in_stack_fffffffffffffef8));
  QDebug::operator<<(this_00,(char *)this);
  QString::~QString((QString *)0x4de4db);
  QString::~QString((QString *)0x4de4e8);
  QString::~QString((QString *)0x4de4f5);
  QDebug::QDebug(pQVar2,(QDebug *)CONCAT26(TVar1,in_stack_fffffffffffffef8));
  QDebugStateSaver::~QDebugStateSaver(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QLocale &l)
{
    QDebugStateSaver saver(dbg);
    const bool isSys = l == QLocale::system();
    dbg.nospace().noquote()
        << (isSys ? "QLocale::system()/* " : "QLocale(")
        << QLocale::languageToString(l.language()) << ", "
        << QLocale::scriptToString(l.script()) << ", "
        << QLocale::territoryToString(l.territory()) << (isSys ? " */" : ")");
    return dbg;
}